

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  size_t n;
  bool bVar6;
  uint8_t to;
  uint8_t from;
  uint8_t num [64];
  char raw [65];
  uint8_t res [64];
  uint8_t local_10a;
  uint8_t local_109;
  uint8_t local_108 [144];
  byte local_78 [72];
  
  local_109 = '\0';
  local_10a = '\0';
  local_108[0x40] = '\n';
  do {
    printf("Please enter a number: ");
    pcVar3 = fgets((char *)(local_108 + 0x40),0x41,_stdin);
    if (pcVar3 == (char *)0x0) goto LAB_00101382;
  } while (local_108[0x40] == '\n');
  local_108[0x30] = '\0';
  local_108[0x31] = '\0';
  local_108[0x32] = '\0';
  local_108[0x33] = '\0';
  local_108[0x34] = '\0';
  local_108[0x35] = '\0';
  local_108[0x36] = '\0';
  local_108[0x37] = '\0';
  local_108[0x38] = '\0';
  local_108[0x39] = '\0';
  local_108[0x3a] = '\0';
  local_108[0x3b] = '\0';
  local_108[0x3c] = '\0';
  local_108[0x3d] = '\0';
  local_108[0x3e] = '\0';
  local_108[0x3f] = '\0';
  local_108[0x20] = '\0';
  local_108[0x21] = '\0';
  local_108[0x22] = '\0';
  local_108[0x23] = '\0';
  local_108[0x24] = '\0';
  local_108[0x25] = '\0';
  local_108[0x26] = '\0';
  local_108[0x27] = '\0';
  local_108[0x28] = '\0';
  local_108[0x29] = '\0';
  local_108[0x2a] = '\0';
  local_108[0x2b] = '\0';
  local_108[0x2c] = '\0';
  local_108[0x2d] = '\0';
  local_108[0x2e] = '\0';
  local_108[0x2f] = '\0';
  local_108[0x10] = '\0';
  local_108[0x11] = '\0';
  local_108[0x12] = '\0';
  local_108[0x13] = '\0';
  local_108[0x14] = '\0';
  local_108[0x15] = '\0';
  local_108[0x16] = '\0';
  local_108[0x17] = '\0';
  local_108[0x18] = '\0';
  local_108[0x19] = '\0';
  local_108[0x1a] = '\0';
  local_108[0x1b] = '\0';
  local_108[0x1c] = '\0';
  local_108[0x1d] = '\0';
  local_108[0x1e] = '\0';
  local_108[0x1f] = '\0';
  local_108[0] = '\0';
  local_108[1] = '\0';
  local_108[2] = '\0';
  local_108[3] = '\0';
  local_108[4] = '\0';
  local_108[5] = '\0';
  local_108[6] = '\0';
  local_108[7] = '\0';
  local_108[8] = '\0';
  local_108[9] = '\0';
  local_108[10] = '\0';
  local_108[0xb] = '\0';
  local_108[0xc] = '\0';
  local_108[0xd] = '\0';
  local_108[0xe] = '\0';
  local_108[0xf] = '\0';
  lVar4 = 0;
  do {
    uVar1 = local_108[lVar4 + 0x40];
    if ((uVar1 == '\0') || (uVar1 == '\n')) break;
    if ((byte)(uVar1 - 0x3a) < 0xf6) {
      printf("Invalid number!");
      return 1;
    }
    local_108[lVar4] = uVar1 + 0xd0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  printf("What base is the number you just entered (2-10)? ");
  iVar2 = __isoc99_scanf("%hhu",&local_109);
  if (iVar2 != -1) {
    do {
      if (((iVar2 != 0) && (0xf6 < (byte)(local_109 - 0xb))) ||
         (puts("This isn\'t a valid number!"), iVar2 != 0)) {
        printf("What base do you want to convert it to (2-10)? ");
        iVar2 = __isoc99_scanf("%hhu",&local_10a);
        if (iVar2 != -1) {
          do {
            if (((iVar2 != 0) && (0xf6 < (byte)(local_10a - 0xb))) ||
               (puts("This isn\'t a valid number!"), iVar2 != 0)) {
              sVar5 = change_base(local_108,local_109,local_10a,local_78);
              if (sVar5 == 0xffffffffffffffff) {
                puts("Couldn\'t change base: this is likely due to an overflow.");
              }
              else {
                printf("Your modified number is: ");
                do {
                  putchar(local_78[sVar5] + 0x30);
                  bVar6 = sVar5 != 0;
                  sVar5 = sVar5 - 1;
                } while (bVar6);
LAB_00101382:
                putchar(10);
              }
              return 0;
            }
            __isoc99_scanf("%*[^\n]");
            iVar2 = __isoc99_scanf("%hhu",&local_10a);
          } while (iVar2 != -1);
        }
        break;
      }
      __isoc99_scanf("%*[^\n]");
      iVar2 = __isoc99_scanf("%hhu",&local_109);
    } while (iVar2 != -1);
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  uint8_t res[64], num[64];
  uint8_t from = 0, to = 0;

  char raw[65];
  raw[0] = '\n';

  while (raw[0] == '\n') {
    printf("Please enter a number: ");
    if (fgets(raw, sizeof raw, stdin) == NULL) {
      printf("\n");
      return 0;
    }
  }

  for (size_t n = 0; n < 64; n++) num[n] = 0;

  for (size_t n = 0; n < 64; n++) {
    if (raw[n] == '\n' || raw[n] == 0) break;
    if (raw[n] < '0' || raw[n] > '9') {
      printf("Invalid number!");
      return 1;
    }
    num[n] = (uint8_t)(raw[n] - '0');
  }

  printf("What base is the number you just entered (2-10)? ");
  int scanf_res = 0;
  while (scanf_res == 0) {
    scanf_res = scanf("%" SCNu8, &from);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res == 0 || from <= 1 || from > 10) {
      printf("This isn't a valid number!\n");
      if (scanf_res == 0) scanf("%*[^\n]");
    }
  }

  printf("What base do you want to convert it to (2-10)? ");
  scanf_res = 0;
  while (scanf_res == 0) {
    scanf_res = scanf("%" SCNu8, &to);
    if (scanf_res == EOF) {
      printf("\n");
      return 0;
    } else if (scanf_res == 0 || to <= 1 || to > 10) {
      printf("This isn't a valid number!\n");
      if (scanf_res == 0) scanf("%*[^\n]");
    }
  }

  size_t max_index = change_base(num, from, to, res);

  if (max_index != (size_t)(-1)) {
    printf("Your modified number is: ");
    for (size_t n = max_index; n != (size_t)(-1); n--) {
      printf("%c", res[n] + '0');
    }
    printf("\n");
  } else {
    printf("Couldn't change base: this is likely due to an overflow.\n");
  }

  return 0;
}